

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

string * __thiscall
ArgsManager::GetChainTypeString_abi_cxx11_(string *__return_storage_ptr__,ArgsManager *this)

{
  variant_alternative_t<1UL,_variant<ChainType,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  *__str;
  long in_FS_OFFSET;
  variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  arg;
  _Variadic_union<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  char local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  GetChainArg_abi_cxx11_
            ((variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_40._M_first,this);
  if (local_20 == '\0') {
    ChainTypeToString_abi_cxx11_(__return_storage_ptr__,(ChainType)local_40._M_first._M_storage);
  }
  else {
    __str = std::get<1ul,ChainType,std::__cxx11::string>
                      ((variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_40._M_first);
    std::__cxx11::string::string((string *)__return_storage_ptr__,__str);
  }
  std::__detail::__variant::
  _Variant_storage<false,_ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_40._M_first);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ArgsManager::GetChainTypeString() const
{
    auto arg = GetChainArg();
    if (auto* parsed = std::get_if<ChainType>(&arg)) return ChainTypeToString(*parsed);
    return std::get<std::string>(arg);
}